

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O1

bool __thiscall Glucose::ClausesBuffer::pushClause(ClausesBuffer *this,int threadId,Clause *c)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  if ((this->whenFullRemoveOlder == false) &&
     (this->maxsize <= this->queuesize + *(int *)&(c->header).field_0x4 + 3)) {
    bVar2 = false;
  }
  else {
    while (uVar4 = *(uint *)&(c->header).field_0x4, this->maxsize <= this->queuesize + uVar4 + 3) {
      this->forcedRemovedClauses = this->forcedRemovedClauses + 1;
      removeLastClause(this);
    }
    puVar1 = (this->elems).data;
    puVar1[(int)this->first] = uVar4;
    uVar4 = this->first + 1;
    uVar3 = 0;
    if (uVar4 == this->maxsize) {
      uVar4 = uVar3;
    }
    this->first = uVar4;
    uVar6 = 1;
    if (1 < this->nbThreads) {
      uVar6 = this->nbThreads - 1;
    }
    puVar1[(int)uVar4] = uVar6;
    uVar4 = this->first + 1;
    if (uVar4 == this->maxsize) {
      uVar4 = uVar3;
    }
    this->first = uVar4;
    puVar1[(int)uVar4] = threadId;
    uVar4 = this->first + 1;
    if (uVar4 == this->maxsize) {
      uVar4 = uVar3;
    }
    this->first = uVar4;
    iVar7 = *(int *)&(c->header).field_0x4;
    if (0 < iVar7) {
      lVar5 = 0;
      do {
        puVar1[(int)this->first] = *(uint *)(&c[1].header.field_0x0 + lVar5 * 4);
        uVar4 = this->first + 1;
        if (uVar4 == this->maxsize) {
          uVar4 = uVar3;
        }
        this->first = uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(long *)&c->header >> 0x20);
      iVar7 = (int)((ulong)*(long *)&c->header >> 0x20);
    }
    this->queuesize = this->queuesize + iVar7 + 3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ClausesBuffer::pushClause(int threadId, Clause & c) {
    if (!whenFullRemoveOlder && (queuesize + c.size() + headerSize >= maxsize))
	return false; // We need to remove some old clauses
    while (queuesize + c.size() + headerSize >= maxsize) { // We need to remove some old clauses
	forcedRemovedClauses ++;
	removeLastClause();
	assert(queuesize > 0);
    }
    noCheckPush(c.size());
    noCheckPush(nbThreads>1?nbThreads-1:1);
    noCheckPush(threadId);
    for(int i=0;i<c.size();i++)
	noCheckPush(toInt(c[i]));
    queuesize += c.size()+headerSize;
    return true;
    //  printf(" -> (%d, %d)\n", first, last);
}